

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O1

void __thiscall
cppjieba::HMMSegment::Viterbi
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *status)

{
  size_type __n;
  HMMModel *this_00;
  pointer puVar1;
  bool bVar2;
  ulong uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  unsigned_long uVar5;
  long lVar6;
  double *pdVar7;
  uint uVar8;
  double *pdVar9;
  long lVar10;
  size_t y_1;
  size_t y;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  vector<double,_std::allocator<double>_> weight;
  vector<int,_std::allocator<int>_> path;
  allocator_type local_91;
  double local_90;
  const_iterator local_88;
  vector<double,_std::allocator<double>_> local_80;
  ulong local_68;
  vector<int,_std::allocator<int>_> local_60;
  size_type local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  const_iterator local_38;
  
  lVar6 = (long)end - (long)begin >> 2;
  local_68 = lVar6 * -0x3333333333333333;
  __n = lVar6 * 0x3333333333333334;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__n,(allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::vector(&local_80,__n,&local_91);
  lVar6 = 0;
  lVar11 = 0;
  local_40 = status;
  do {
    this_00 = this->model_;
    local_90 = this_00->startProb[lVar11];
    dVar14 = HMMModel::GetEmitProb
                       (this_00,(this_00->emitProbVec).
                                super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar11],begin->rune,
                        -3.14e+100);
    uVar3 = local_68;
    *(double *)
     ((long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar6 * 2) = local_90 + dVar14;
    *(undefined4 *)
     ((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start + lVar6) = 0xffffffff;
    lVar11 = lVar11 + 1;
    lVar6 = lVar6 + __n;
  } while (lVar11 != 4);
  local_48 = __n;
  if (1 < local_68) {
    uVar13 = 1;
    local_90 = 0.0;
    local_38 = begin;
    do {
      local_88 = local_38 + uVar13;
      lVar6 = 0x28;
      lVar11 = 0;
      do {
        lVar12 = lVar11 * local_68 + uVar13;
        local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar12] = -3.14e+100;
        local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar12] = 1;
        dVar15 = HMMModel::GetEmitProb
                           (this->model_,
                            (this->model_->emitProbVec).
                            super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar11],local_88->rune,
                            -3.14e+100);
        dVar14 = local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
        pdVar7 = (double *)
                 ((long)local_90 +
                 (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
        pdVar9 = (double *)(this->model_->statMap + lVar6);
        lVar10 = 0;
        do {
          dVar16 = *pdVar7 + *pdVar9 + dVar15;
          if (dVar14 < dVar16) {
            local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12] = dVar16;
            local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar12] = (int)lVar10;
            dVar14 = dVar16;
          }
          lVar10 = lVar10 + 1;
          pdVar7 = pdVar7 + uVar3;
          pdVar9 = pdVar9 + 4;
        } while (lVar10 != 4);
        lVar11 = lVar11 + 1;
        lVar6 = lVar6 + 8;
      } while (lVar11 != 4);
      uVar13 = uVar13 + 1;
      local_90 = (double)((long)local_90 + 8);
    } while (uVar13 != local_68);
  }
  pvVar4 = local_40;
  uVar3 = local_68;
  local_90 = local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[local_68 * 2 + -1];
  local_88 = (const_iterator)
             local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[local_68 * 4 + -1];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_40,local_68);
  uVar8 = (int)uVar3 - 1;
  if (-1 < (int)uVar8) {
    uVar5 = (ulong)(local_90 < (double)local_88) * 2 + 1;
    puVar1 = (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (ulong)(uVar8 & 0x7fffffff) + 1;
    do {
      puVar1[lVar6 + -1] = uVar5;
      uVar5 = (unsigned_long)
              *(int *)((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar6 * 4 + uVar5 * local_48 + -4);
      lVar11 = lVar6 + -1;
      bVar2 = 0 < lVar6;
      lVar6 = lVar11;
    } while (lVar11 != 0 && bVar2);
  }
  if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Viterbi(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<size_t>& status) const {
    size_t Y = HMMModel::STATUS_SUM;
    size_t X = end - begin;

    size_t XYSize = X * Y;
    size_t now, old, stat;
    double tmp, endE, endS;

    vector<int> path(XYSize);
    vector<double> weight(XYSize);

    //start
    for (size_t y = 0; y < Y; y++) {
      weight[0 + y * X] = model_->startProb[y] + model_->GetEmitProb(model_->emitProbVec[y], begin->rune, MIN_DOUBLE);
      path[0 + y * X] = -1;
    }

    double emitProb;

    for (size_t x = 1; x < X; x++) {
      for (size_t y = 0; y < Y; y++) {
        now = x + y*X;
        weight[now] = MIN_DOUBLE;
        path[now] = HMMModel::E; // warning
        emitProb = model_->GetEmitProb(model_->emitProbVec[y], (begin+x)->rune, MIN_DOUBLE);
        for (size_t preY = 0; preY < Y; preY++) {
          old = x - 1 + preY * X;
          tmp = weight[old] + model_->transProb[preY][y] + emitProb;
          if (tmp > weight[now]) {
            weight[now] = tmp;
            path[now] = preY;
          }
        }
      }
    }

    endE = weight[X-1+HMMModel::E*X];
    endS = weight[X-1+HMMModel::S*X];
    stat = 0;
    if (endE >= endS) {
      stat = HMMModel::E;
    } else {
      stat = HMMModel::S;
    }

    status.resize(X);
    for (int x = X -1 ; x >= 0; x--) {
      status[x] = stat;
      stat = path[x + stat*X];
    }
  }